

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

int rtosc_arg_val_negate(rtosc_arg_val_t *av)

{
  rtosc_arg_val_t *av_local;
  int local_4;
  
  switch(av->type) {
  case 'F':
    (av->val).T = '\x01';
    av->type = 'T';
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case 'T':
    (av->val).T = '\0';
    av->type = 'F';
    local_4 = 1;
    break;
  case 'c':
  case 'i':
    (av->val).i = -(av->val).i;
    local_4 = 1;
    break;
  case 'd':
    (av->val).t = (av->val).t ^ 0x8000000000000000;
    local_4 = 1;
    break;
  case 'f':
    (av->val).i = (av->val).i ^ 0x80000000;
    local_4 = 1;
    break;
  case 'h':
    (av->val).h = -(av->val).h;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int rtosc_arg_val_negate(rtosc_arg_val_t* av)
{
    switch(av->type)
    {
        case 'h': av->val.h = -av->val.h; return true;
        case 'd': av->val.d = -av->val.d; return true;
        case 'f': av->val.f = -av->val.f; return true;
        case 'c':
        case 'i': av->val.i = -av->val.i; return true;
        case 'T': av->val.T = 0; av->type = 'F'; return true;
        case 'F': av->val.T = 1; av->type = 'T'; return true;
        default: return false;
    }
}